

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass_manager.cpp
# Opt level: O1

Status __thiscall spvtools::opt::PassManager::Run(PassManager *this,IRContext *context)

{
  ostream *poVar1;
  Pass *pPVar2;
  _Manager_type p_Var3;
  Module *this_00;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  uint32_t uVar8;
  undefined4 extraout_var;
  pointer *__ptr;
  char *pcVar9;
  pointer puVar10;
  unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_> *pass;
  pointer puVar11;
  bool bVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  anon_class_16_2_5d5469c6 print_disassembly;
  string msg;
  ScopedTimer<spvtools::utils::Timer> timer__LINE__;
  spv_position_t null_pos;
  SpirvTools tools;
  Status local_104;
  IRContext *local_100;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  _func_int **local_e0;
  code *local_d8;
  pointer local_d0;
  anon_class_16_2_5d5469c6 local_c8;
  long *local_b8 [2];
  long local_a8 [2];
  _Any_data local_98;
  _Manager_type local_88;
  _Invoker_type p_Stack_80;
  ScopedTimer<spvtools::utils::Timer> local_70;
  spv_position_t local_58;
  SpirvTools local_38;
  
  local_c8.context = &local_100;
  local_100 = context;
  local_c8.this = this;
  utils::PrintTimerDescription(this->time_report_stream_,true);
  puVar11 = (this->passes_).
            super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (this->passes_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar12 = puVar11 == local_d0;
  if (bVar12) {
    local_104 = SuccessWithoutChange;
  }
  else {
    local_d8 = utils::Timer::Start;
    local_104 = SuccessWithoutChange;
    local_e0 = (_func_int **)&PTR_Start_00b70060;
    do {
      Run::anon_class_16_2_5d5469c6::operator()
                (&local_c8,"; IR before pass ",
                 (puVar11->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                 .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl);
      poVar1 = this->time_report_stream_;
      pPVar2 = (puVar11->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
               .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
      pcVar9 = "";
      if (pPVar2 != (Pass *)0x0) {
        iVar6 = (*pPVar2->_vptr_Pass[2])();
        pcVar9 = (char *)CONCAT44(extraout_var,iVar6);
      }
      local_70._vptr_ScopedTimer = (_func_int **)&PTR__ScopedTimer_00b15f48;
      local_70.timer = (Timer *)operator_new(0x180);
      (local_70.timer)->_vptr_Timer = local_e0;
      (local_70.timer)->report_stream_ = poVar1;
      (local_70.timer)->usage_status_ = 0;
      (local_70.timer)->measure_mem_usage_ = true;
      local_70.tag_ = pcVar9;
      (*local_d8)(local_70.timer);
      SVar7 = Pass::Run((puVar11->_M_t).
                        super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                        .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl,local_100)
      ;
      if (SVar7 == Failure) {
LAB_004f1976:
        bVar5 = false;
      }
      else {
        if (SVar7 == SuccessWithChange) {
          local_104 = SuccessWithChange;
        }
        if (this->validate_after_all_ == true) {
          SpirvTools::SpirvTools(&local_38,this->target_env_);
          local_88 = (_Manager_type)0x0;
          p_Stack_80 = (_Invoker_type)0x0;
          local_98._M_unused._M_object = (void *)0x0;
          local_98._8_8_ = 0;
          p_Var3 = (this->consumer_).super__Function_base._M_manager;
          if (p_Var3 != (_Manager_type)0x0) {
            (*p_Var3)(&local_98,(_Any_data *)this,__clone_functor);
            p_Stack_80 = (this->consumer_)._M_invoker;
            local_88 = (this->consumer_).super__Function_base._M_manager;
          }
          SpirvTools::SetMessageConsumer(&local_38,(MessageConsumer *)&local_98);
          if (local_88 != (_Manager_type)0x0) {
            (*local_88)(&local_98,&local_98,__destroy_functor);
          }
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (uint32_t *)0x0;
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          Module::ToBinary((local_100->module_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                           &local_f8,true);
          bVar5 = SpirvTools::Validate
                            (&local_38,
                             local_f8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                             (long)local_f8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_f8.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2,this->val_options_)
          ;
          if (!bVar5) {
            local_b8[0] = local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"Validation failed after pass ","");
            (*((puVar11->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
               .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl)->_vptr_Pass[2])();
            std::__cxx11::string::append((char *)local_b8);
            local_58.line = 0;
            local_58.column = 0;
            local_58.index = 0;
            std::
            function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
            ::operator()(&this->consumer_,SPV_MSG_INTERNAL_ERROR,"",&local_58,(char *)local_b8[0]);
            if (local_b8[0] != local_a8) {
              operator_delete(local_b8[0],local_a8[0] + 1);
            }
            if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint32_t *)0x0) {
              operator_delete(local_f8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_f8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            SpirvTools::~SpirvTools(&local_38);
            goto LAB_004f1976;
          }
          if (local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (uint32_t *)0x0) {
            operator_delete(local_f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          SpirvTools::~SpirvTools(&local_38);
        }
        pPVar2 = (puVar11->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                 .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
        (puVar11->_M_t).
        super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
        super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl = (Pass *)0x0;
        bVar5 = true;
        if (pPVar2 != (Pass *)0x0) {
          (*pPVar2->_vptr_Pass[1])();
        }
      }
      utils::ScopedTimer<spvtools::utils::Timer>::~ScopedTimer(&local_70);
      if (!bVar5) break;
      puVar11 = puVar11 + 1;
      bVar12 = puVar11 == local_d0;
    } while (!bVar12);
  }
  SVar7 = Failure;
  if (bVar12) {
    Run::anon_class_16_2_5d5469c6::operator()(&local_c8,"; IR after last pass",(Pass *)0x0);
    if (local_104 == SuccessWithChange) {
      this_00 = (local_100->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      uVar8 = Module::ComputeIdBound(this_00);
      if (uVar8 == 0) {
        __assert_fail("bound != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/module.h"
                      ,0x3c,"void spvtools::opt::Module::SetIdBound(uint32_t)");
      }
      (this_00->header_).bound = uVar8;
    }
    puVar11 = (this->passes_).
              super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->passes_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar10 = puVar11;
    SVar7 = local_104;
    if (puVar4 != puVar11) {
      do {
        pPVar2 = (puVar10->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                 .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
        if (pPVar2 != (Pass *)0x0) {
          (*pPVar2->_vptr_Pass[1])();
        }
        (puVar10->_M_t).
        super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
        super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl = (Pass *)0x0;
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar4);
      (this->passes_).
      super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar11;
    }
  }
  return SVar7;
}

Assistant:

Pass::Status PassManager::Run(IRContext* context) {
  auto status = Pass::Status::SuccessWithoutChange;

  // If print_all_stream_ is not null, prints the disassembly of the module
  // to that stream, with the given preamble and optionally the pass name.
  auto print_disassembly = [&context, this](const char* preamble, Pass* pass) {
    if (print_all_stream_) {
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, false);
      SpirvTools t(target_env_);
      t.SetMessageConsumer(consumer());
      std::string disassembly;
      std::string pass_name = (pass ? pass->name() : "");
      if (!t.Disassemble(binary, &disassembly)) {
        std::string msg = "Disassembly failed before pass ";
        msg += pass_name + "\n";
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_WARNING, "", null_pos, msg.c_str());
        return;
      }
      *print_all_stream_ << preamble << pass_name << "\n"
                         << disassembly << std::endl;
    }
  };

  SPIRV_TIMER_DESCRIPTION(time_report_stream_, /* measure_mem_usage = */ true);
  for (auto& pass : passes_) {
    print_disassembly("; IR before pass ", pass.get());
    SPIRV_TIMER_SCOPED(time_report_stream_, (pass ? pass->name() : ""), true);
    const auto one_status = pass->Run(context);
    if (one_status == Pass::Status::Failure) return one_status;
    if (one_status == Pass::Status::SuccessWithChange) status = one_status;

    if (validate_after_all_) {
      spvtools::SpirvTools tools(target_env_);
      tools.SetMessageConsumer(consumer());
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, true);
      if (!tools.Validate(binary.data(), binary.size(), val_options_)) {
        std::string msg = "Validation failed after pass ";
        msg += pass->name();
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_INTERNAL_ERROR, "", null_pos, msg.c_str());
        return Pass::Status::Failure;
      }
    }

    // Reset the pass to free any memory used by the pass.
    pass.reset(nullptr);
  }
  print_disassembly("; IR after last pass", nullptr);

  // Set the Id bound in the header in case a pass forgot to do so.
  //
  // TODO(dnovillo): This should be unnecessary and automatically maintained by
  // the IRContext.
  if (status == Pass::Status::SuccessWithChange) {
    context->module()->SetIdBound(context->module()->ComputeIdBound());
  }
  passes_.clear();
  return status;
}